

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
          (SmallVectorBase<slang::ast::EvalContext::Frame> *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  SmallVectorBase<slang::ast::EvalContext::Frame> *this_local;
  
  __first = begin(this);
  __last = end(this);
  std::destroy<slang::ast::EvalContext::Frame*>(__first,__last);
  bVar1 = isSmall(this);
  if (!bVar1) {
    free(this->data_);
  }
  return;
}

Assistant:

void cleanup() {
        std::destroy(begin(), end());
        if (!isSmall())
            free(data_);
    }